

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::reserveVars(SimpSolver *this,Var v)

{
  long in_RDI;
  vec<int> *unaff_retaddr;
  Var in_stack_0000001c;
  Solver *in_stack_00000020;
  EVP_PKEY_CTX local_c [8];
  int min_cap;
  
  unique0x1000010a = in_RDI;
  Solver::reserveVars(in_stack_00000020,in_stack_0000001c);
  min_cap = (int)((ulong)stack0xfffffffffffffff8 >> 0x20);
  vec<char>::capacity((vec<char> *)unaff_retaddr,min_cap);
  vec<char>::capacity((vec<char> *)unaff_retaddr,min_cap);
  if ((*(byte *)(in_RDI + 0x1430) & 1) != 0) {
    vec<int>::capacity(unaff_retaddr,min_cap);
    vec<int>::capacity(unaff_retaddr,min_cap);
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::init
              ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
               (in_RDI + 0x1458),local_c);
    vec<char>::capacity((vec<char> *)unaff_retaddr,min_cap);
  }
  return;
}

Assistant:

void SimpSolver::reserveVars(Var v)
{
    Solver::reserveVars(v);

    frozen.capacity(v + 1);
    eliminated.capacity(v + 1);

    if (use_simplification) {
        n_occ.capacity(v + 1);
        n_occ.capacity(v + 1);
        occurs.init(v);
        touched.capacity(v + 1);
    }
}